

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

int disas_neon_ls_insn(DisasContext_conflict1 *s,uint32_t insn)

{
  ARMMMUIdx index;
  TCGContext_conflict1 *tcg_ctx;
  TCGv_ptr pTVar1;
  TCGOpcode TVar2;
  uint32_t oprsz;
  long lVar3;
  TCGv_i64 val;
  TCGv_i32 pTVar4;
  TCGv_i32 pTVar5;
  TCGTemp *pTVar6;
  TCGArg TVar7;
  uint uVar8;
  uint uVar9;
  uint32_t dofs;
  int iVar10;
  uintptr_t o;
  int32_t arg2;
  uint uVar11;
  MemOp MVar12;
  uint uVar13;
  uint reg;
  uint reg_00;
  int iVar14;
  uint element;
  int iVar15;
  MemOp MVar16;
  MemOp size;
  uint uVar17;
  uintptr_t o_8;
  bool bVar18;
  int local_a0;
  int local_9c;
  
  if (s->fp_excp_el != 0) {
    gen_exception_insn(s,(uint32_t)s->pc_curr,1,0x1fe00020,s->fp_excp_el);
    return 0;
  }
  if (s->vfp_enabled != true) {
    return 1;
  }
  tcg_ctx = s->uc->tcg_ctx;
  if ((s->isar->mvfr0 & 0xe) == 0) {
    if ((insn >> 0x16 & 1) != 0) {
      return 1;
    }
    uVar13 = insn >> 0xc & 0xf;
  }
  else {
    uVar13 = insn >> 0x12 & 0x10 | insn >> 0xc & 0xf;
  }
  reg_00 = insn >> 0x10 & 0xf;
  if ((insn >> 0x17 & 1) == 0) {
    uVar8 = insn >> 8 & 0xf;
    if (10 < uVar8) {
      return 1;
    }
    MVar16 = s->be_data;
    uVar11 = insn >> 8 & 0xc;
    if (uVar11 == 8) {
      if ((~insn & 0x30) == 0) {
        return 1;
      }
    }
    else if ((uVar11 == 4) && ((insn & 0x20) != 0)) {
      return 1;
    }
    MVar12 = insn >> 6 & MO_64;
    iVar14 = neon_ls_element_type[uVar8].nregs;
    uVar11 = neon_ls_element_type[uVar8].interleave;
    uVar8 = neon_ls_element_type[uVar8].spacing;
    if ((MVar12 == MO_64) && ((uVar8 | uVar11) != 1)) {
      return 1;
    }
    index = s->mmu_idx & 0xf;
    if (MVar12 == MO_8) {
      MVar16 = MO_8;
    }
    size = MO_64;
    if (uVar11 != 1 || MVar16 != MO_8) {
      size = MVar12;
    }
    val = tcg_temp_new_i64(tcg_ctx);
    pTVar4 = tcg_temp_new_i32(tcg_ctx);
    pTVar5 = tcg_const_i32_aarch64(tcg_ctx,1 << (sbyte)size);
    load_reg_var(s,pTVar4,reg_00);
    pTVar6 = (TCGTemp *)(val + (long)tcg_ctx);
    uVar9 = 0;
    if (0 < (int)uVar11) {
      uVar9 = uVar11;
    }
    iVar10 = 0;
    iVar15 = 0;
    if (0 < iVar14) {
      iVar15 = iVar14;
    }
    for (; iVar10 != iVar15; iVar10 = iVar10 + 1) {
      for (element = 0; uVar17 = uVar9, reg = uVar13, element != 8U >> (sbyte)size;
          element = element + 1) {
        while (uVar17 != 0) {
          if ((insn >> 0x15 & 1) == 0) {
            TVar7 = neon_element_offset(reg,element,size);
            switch(MVar12) {
            case MO_8:
              TVar2 = INDEX_op_ld8u_i64;
              break;
            case MO_16:
              TVar2 = INDEX_op_ld16u_i64;
              break;
            case MO_32:
              TVar2 = INDEX_op_ld32u_i64;
              break;
            default:
              tcg_gen_ld_i64_aarch64(tcg_ctx,val,tcg_ctx->cpu_env,TVar7);
              goto LAB_005e2565;
            }
            tcg_gen_op3_aarch64(tcg_ctx,TVar2,(TCGArg)pTVar6,
                                (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),TVar7);
LAB_005e2565:
            gen_aa32_st_i64(s,val,pTVar4,index,MVar16 | size);
          }
          else {
            gen_aa32_ld_i64(s,val,pTVar4,index,MVar16 | size);
            TVar7 = neon_element_offset(reg,element,size);
            switch(MVar12) {
            case MO_8:
              TVar2 = INDEX_op_st8_i64;
              break;
            case MO_16:
              TVar2 = INDEX_op_st16_i64;
              break;
            case MO_32:
              TVar2 = INDEX_op_st32_i64;
              break;
            default:
              tcg_gen_st_i64_aarch64(tcg_ctx,val,tcg_ctx->cpu_env,TVar7);
              goto LAB_005e259b;
            }
            tcg_gen_op3_aarch64(tcg_ctx,TVar2,(TCGArg)pTVar6,
                                (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),TVar7);
          }
LAB_005e259b:
          tcg_gen_add_i32(tcg_ctx,pTVar4,pTVar4,pTVar5);
          uVar17 = uVar17 - 1;
          reg = reg + uVar8;
        }
      }
      uVar13 = uVar13 + 1;
    }
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar5 + (long)tcg_ctx));
    tcg_temp_free_internal_aarch64(tcg_ctx,pTVar6);
    arg2 = iVar14 * uVar11 * 8;
    goto LAB_005e2661;
  }
  MVar16 = insn >> 10 & MO_64;
  uVar8 = insn >> 4;
  switch(MVar16) {
  case MO_8:
    uVar11 = insn >> 5 & 7;
    local_a0 = 1;
    uVar9 = insn >> 8 & 3;
    local_9c = uVar9 + 1;
    switch(uVar9) {
    case 0:
      goto switchD_005e1f6a_caseD_0;
    case 2:
switchD_005e1f6a_caseD_2:
      if ((insn & 0x10) != 0) {
        return 1;
      }
    case 1:
switchD_005e1f6a_caseD_1:
      if ((insn & 0x20) != 0 && MVar16 == MO_32) {
        return 1;
      }
      break;
    case 3:
switchD_005e1f6a_caseD_3:
      if ((~insn & 0x30) == 0 && MVar16 == MO_32) {
        return 1;
      }
    }
    goto LAB_005e21be;
  case MO_16:
    uVar11 = insn >> 6 & 3;
    local_a0 = 2 - (uint)((insn & 0x20) == 0);
    uVar9 = insn >> 8 & 3;
    local_9c = uVar9 + 1;
    switch(uVar9) {
    case 1:
      goto switchD_005e1f6a_caseD_1;
    case 2:
      goto switchD_005e1f6a_caseD_2;
    case 3:
      goto switchD_005e1f6a_caseD_3;
    }
    break;
  case MO_32:
    uVar11 = insn >> 7 & 1;
    local_a0 = 2 - (uint)((insn & 0x40) == 0);
    uVar9 = insn >> 8 & 3;
    local_9c = uVar9 + 1;
    switch(uVar9) {
    case 1:
      goto switchD_005e1f6a_caseD_1;
    case 2:
      goto switchD_005e1f6a_caseD_2;
    case 3:
      goto switchD_005e1f6a_caseD_3;
    }
    break;
  case MO_64:
    if ((insn >> 0x15 & 1) == 0) {
      return 1;
    }
    MVar16 = insn >> 6 & MO_64;
    uVar11 = insn >> 8 & 3;
    local_9c = uVar11 + 1;
    if ((MVar16 == MO_64) && (MVar16 = MO_32, (uVar8 & 1) == 0 || local_9c != 4)) {
      return 1;
    }
    if (((uVar8 & 1) != 0) && (MVar16 == MO_8 && uVar11 == 0 || local_9c == 3)) {
      return 1;
    }
    pTVar4 = tcg_temp_new_i32(tcg_ctx);
    load_reg_var(s,pTVar4,reg_00);
    iVar14 = 2 - (uint)((insn & 0x20) == 0);
    oprsz = iVar14 * 8;
    if (uVar11 != 0) {
      oprsz = 8;
    }
    pTVar5 = tcg_temp_new_i32(tcg_ctx);
    iVar15 = local_9c;
    while (bVar18 = iVar15 != 0, iVar15 = iVar15 + -1, bVar18) {
      gen_aa32_ld_i32(s,pTVar5,pTVar4,s->mmu_idx & 0xf,s->be_data | MVar16);
      lVar3 = neon_reg_offset(uVar13,0);
      dofs = (uint32_t)lVar3;
      if (((uVar13 & 1) == 0) || (oprsz != 0x10)) {
        tcg_gen_gvec_dup_i32_aarch64(tcg_ctx,MVar16,dofs,oprsz,oprsz,pTVar5);
      }
      else {
        tcg_gen_gvec_dup_i32_aarch64(tcg_ctx,MVar16,dofs,8,8,pTVar5);
        lVar3 = neon_reg_offset(uVar13 + 1,0);
        tcg_gen_gvec_mov_aarch64(tcg_ctx,0,(uint32_t)lVar3,dofs,8,8);
      }
      tcg_gen_addi_i32_aarch64(tcg_ctx,pTVar4,pTVar4,1 << (sbyte)MVar16);
      uVar13 = uVar13 + iVar14;
    }
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar5 + (long)tcg_ctx));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
    goto LAB_005e265b;
  }
switchD_005e1f6a_caseD_0:
  if ((uVar8 >> MVar16 & 1) != 0) {
    return 1;
  }
  if ((MVar16 == MO_32) && ((uVar8 & 3) - 1 < 2)) {
    return 1;
  }
LAB_005e21be:
  if (0x1f < uVar9 * local_a0 + uVar13) {
    return 1;
  }
  pTVar4 = tcg_temp_new_i32(tcg_ctx);
  pTVar5 = tcg_temp_new_i32(tcg_ctx);
  load_reg_var(s,pTVar5,reg_00);
  pTVar6 = (TCGTemp *)(pTVar4 + (long)tcg_ctx);
  iVar14 = local_9c;
  while (bVar18 = iVar14 != 0, iVar14 = iVar14 + -1, bVar18) {
    if ((insn >> 0x15 & 1) == 0) {
      TVar7 = neon_element_offset(uVar13,uVar11,MVar16);
      pTVar1 = tcg_ctx->cpu_env;
      if (MVar16 == MO_32) {
        tcg_gen_ld_i32(tcg_ctx,pTVar4,pTVar1,TVar7);
      }
      else if (MVar16 == MO_16) {
        tcg_gen_ld16u_i32(tcg_ctx,pTVar4,pTVar1,TVar7);
      }
      else {
        tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_ld8u_i32,(TCGArg)pTVar6,
                            (TCGArg)(pTVar1 + (long)tcg_ctx),TVar7);
      }
      gen_aa32_st_i32(s,pTVar4,pTVar5,s->mmu_idx & 0xf,s->be_data | MVar16);
    }
    else {
      gen_aa32_ld_i32(s,pTVar4,pTVar5,s->mmu_idx & 0xf,s->be_data | MVar16);
      TVar7 = neon_element_offset(uVar13,uVar11,MVar16);
      pTVar1 = tcg_ctx->cpu_env;
      if (MVar16 == MO_32) {
        tcg_gen_st_i32(tcg_ctx,pTVar4,pTVar1,TVar7);
      }
      else if (MVar16 == MO_16) {
        tcg_gen_st16_i32(tcg_ctx,pTVar4,pTVar1,TVar7);
      }
      else {
        tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_st8_i32,(TCGArg)pTVar6,(TCGArg)(pTVar1 + (long)tcg_ctx)
                            ,TVar7);
      }
    }
    uVar13 = uVar13 + local_a0;
    tcg_gen_addi_i32_aarch64(tcg_ctx,pTVar5,pTVar5,1 << (sbyte)MVar16);
  }
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar5 + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,pTVar6);
LAB_005e265b:
  arg2 = local_9c << (sbyte)MVar16;
LAB_005e2661:
  uVar13 = insn & 0xf;
  if (uVar13 != 0xf) {
    pTVar4 = load_reg(s,reg_00);
    if (uVar13 == 0xd) {
      tcg_gen_addi_i32_aarch64(tcg_ctx,pTVar4,pTVar4,arg2);
    }
    else {
      pTVar5 = load_reg(s,uVar13);
      tcg_gen_add_i32(tcg_ctx,pTVar4,pTVar4,pTVar5);
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar5 + (long)tcg_ctx));
    }
    store_reg(s,reg_00,pTVar4);
    return 0;
  }
  return 0;
}

Assistant:

static int disas_neon_ls_insn(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int rd, rn, rm;
    int op;
    int nregs;
    int interleave;
    int spacing;
    int stride;
    int size;
    int reg;
    int load;
    int n;
    int vec_size;
    int mmu_idx;
    MemOp endian;
    TCGv_i32 addr;
    TCGv_i32 tmp;
    TCGv_i32 tmp2;
    TCGv_i64 tmp64;

    /* FIXME: this access check should not take precedence over UNDEF
     * for invalid encodings; we will generate incorrect syndrome information
     * for attempts to execute invalid vfp/neon encodings with FP disabled.
     */
    if (s->fp_excp_el) {
        gen_exception_insn(s, s->pc_curr, EXCP_UDEF,
                           syn_simd_access_trap(1, 0xe, false), s->fp_excp_el);
        return 0;
    }

    if (!s->vfp_enabled)
      return 1;
    VFP_DREG_D(rd, insn);
    rn = (insn >> 16) & 0xf;
    rm = insn & 0xf;
    load = (insn & (1 << 21)) != 0;
    endian = s->be_data;
    mmu_idx = get_mem_index(s);
    if ((insn & (1 << 23)) == 0) {
        /* Load store all elements.  */
        op = (insn >> 8) & 0xf;
        size = (insn >> 6) & 3;
        if (op > 10)
            return 1;
        /* Catch UNDEF cases for bad values of align field */
        switch (op & 0xc) {
        case 4:
            if (((insn >> 5) & 1) == 1) {
                return 1;
            }
            break;
        case 8:
            if (((insn >> 4) & 3) == 3) {
                return 1;
            }
            break;
        default:
            break;
        }
        nregs = neon_ls_element_type[op].nregs;
        interleave = neon_ls_element_type[op].interleave;
        spacing = neon_ls_element_type[op].spacing;
        if (size == 3 && (interleave | spacing) != 1) {
            return 1;
        }
        /* For our purposes, bytes are always little-endian.  */
        if (size == 0) {
            endian = MO_LE;
        }
        /* Consecutive little-endian elements from a single register
         * can be promoted to a larger little-endian operation.
         */
        if (interleave == 1 && endian == MO_LE) {
            size = 3;
        }
        tmp64 = tcg_temp_new_i64(tcg_ctx);
        addr = tcg_temp_new_i32(tcg_ctx);
        tmp2 = tcg_const_i32(tcg_ctx, 1 << size);
        load_reg_var(s, addr, rn);
        for (reg = 0; reg < nregs; reg++) {
            for (n = 0; n < 8 >> size; n++) {
                int xs;
                for (xs = 0; xs < interleave; xs++) {
                    int tt = rd + reg + spacing * xs;

                    if (load) {
                        gen_aa32_ld_i64(s, tmp64, addr, mmu_idx, endian | size);
                        neon_store_element64(tcg_ctx, tt, n, size, tmp64);
                    } else {
                        neon_load_element64(tcg_ctx, tmp64, tt, n, size);
                        gen_aa32_st_i64(s, tmp64, addr, mmu_idx, endian | size);
                    }
                    tcg_gen_add_i32(tcg_ctx, addr, addr, tmp2);
                }
            }
        }
        tcg_temp_free_i32(tcg_ctx, addr);
        tcg_temp_free_i32(tcg_ctx, tmp2);
        tcg_temp_free_i64(tcg_ctx, tmp64);
        stride = nregs * interleave * 8;
    } else {
        size = (insn >> 10) & 3;
        if (size == 3) {
            /* Load single element to all lanes.  */
            int a = (insn >> 4) & 1;
            if (!load) {
                return 1;
            }
            size = (insn >> 6) & 3;
            nregs = ((insn >> 8) & 3) + 1;

            if (size == 3) {
                if (nregs != 4 || a == 0) {
                    return 1;
                }
                /* For VLD4 size==3 a == 1 means 32 bits at 16 byte alignment */
                size = 2;
            }
            if (nregs == 1 && a == 1 && size == 0) {
                return 1;
            }
            if (nregs == 3 && a == 1) {
                return 1;
            }
            addr = tcg_temp_new_i32(tcg_ctx);
            load_reg_var(s, addr, rn);

            /* VLD1 to all lanes: bit 5 indicates how many Dregs to write.
             * VLD2/3/4 to all lanes: bit 5 indicates register stride.
             */
            stride = (insn & (1 << 5)) ? 2 : 1;
            vec_size = nregs == 1 ? stride * 8 : 8;

            tmp = tcg_temp_new_i32(tcg_ctx);
            for (reg = 0; reg < nregs; reg++) {
                gen_aa32_ld_i32(s, tmp, addr, get_mem_index(s),
                                s->be_data | size);
                if ((rd & 1) && vec_size == 16) {
                    /* We cannot write 16 bytes at once because the
                     * destination is unaligned.
                     */
                    tcg_gen_gvec_dup_i32(tcg_ctx, size, neon_reg_offset(rd, 0),
                                         8, 8, tmp);
                    tcg_gen_gvec_mov(tcg_ctx, 0, neon_reg_offset(rd + 1, 0),
                                     neon_reg_offset(rd, 0), 8, 8);
                } else {
                    tcg_gen_gvec_dup_i32(tcg_ctx, size, neon_reg_offset(rd, 0),
                                         vec_size, vec_size, tmp);
                }
                tcg_gen_addi_i32(tcg_ctx, addr, addr, 1 << size);
                rd += stride;
            }
            tcg_temp_free_i32(tcg_ctx, tmp);
            tcg_temp_free_i32(tcg_ctx, addr);
            stride = (1 << size) * nregs;
        } else {
            /* Single element.  */
            int idx = (insn >> 4) & 0xf;
            int reg_idx;
            switch (size) {
            case 0:
                reg_idx = (insn >> 5) & 7;
                stride = 1;
                break;
            case 1:
                reg_idx = (insn >> 6) & 3;
                stride = (insn & (1 << 5)) ? 2 : 1;
                break;
            case 2:
                reg_idx = (insn >> 7) & 1;
                stride = (insn & (1 << 6)) ? 2 : 1;
                break;
            default:
                abort();
            }
            nregs = ((insn >> 8) & 3) + 1;
            /* Catch the UNDEF cases. This is unavoidably a bit messy. */
            switch (nregs) {
            case 1:
                if (((idx & (1 << size)) != 0) ||
                    (size == 2 && ((idx & 3) == 1 || (idx & 3) == 2))) {
                    return 1;
                }
                break;
            case 3:
                if ((idx & 1) != 0) {
                    return 1;
                }
                /* fall through */
            case 2:
                if (size == 2 && (idx & 2) != 0) {
                    return 1;
                }
                break;
            case 4:
                if ((size == 2) && ((idx & 3) == 3)) {
                    return 1;
                }
                break;
            default:
                abort();
            }
            if ((rd + stride * (nregs - 1)) > 31) {
                /* Attempts to write off the end of the register file
                 * are UNPREDICTABLE; we choose to UNDEF because otherwise
                 * the neon_load_reg() would write off the end of the array.
                 */
                return 1;
            }
            tmp = tcg_temp_new_i32(tcg_ctx);
            addr = tcg_temp_new_i32(tcg_ctx);
            load_reg_var(s, addr, rn);
            for (reg = 0; reg < nregs; reg++) {
                if (load) {
                    gen_aa32_ld_i32(s, tmp, addr, get_mem_index(s),
                                    s->be_data | size);
                    neon_store_element(tcg_ctx, rd, reg_idx, size, tmp);
                } else { /* Store */
                    neon_load_element(tcg_ctx, tmp, rd, reg_idx, size);
                    gen_aa32_st_i32(s, tmp, addr, get_mem_index(s),
                                    s->be_data | size);
                }
                rd += stride;
                tcg_gen_addi_i32(tcg_ctx, addr, addr, 1 << size);
            }
            tcg_temp_free_i32(tcg_ctx, addr);
            tcg_temp_free_i32(tcg_ctx, tmp);
            stride = nregs * (1 << size);
        }
    }
    if (rm != 15) {
        TCGv_i32 base;

        base = load_reg(s, rn);
        if (rm == 13) {
            tcg_gen_addi_i32(tcg_ctx, base, base, stride);
        } else {
            TCGv_i32 index;
            index = load_reg(s, rm);
            tcg_gen_add_i32(tcg_ctx, base, base, index);
            tcg_temp_free_i32(tcg_ctx, index);
        }
        store_reg(s, rn, base);
    }
    return 0;
}